

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O3

bool __thiscall MT32Emu::Poly::noteOff(Poly *this,bool pedalHeld)

{
  PolyState PVar1;
  bool bVar2;
  
  PVar1 = this->state;
  if ((PVar1 & ~POLY_Held) == POLY_Releasing) {
LAB_0018382e:
    bVar2 = false;
  }
  else {
    if (pedalHeld) {
      if (PVar1 == POLY_Held) goto LAB_0018382e;
      this->state = POLY_Held;
      (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,1);
    }
    else {
      startDecay(this);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Poly::noteOff(bool pedalHeld) {
	// Generally, non-sustaining instruments ignore note off. They die away eventually anyway.
	// Key 0 (only used by special cases on rhythm part) reacts to note off even if non-sustaining or pedal held.
	if (state == POLY_Inactive || state == POLY_Releasing) {
		return false;
	}
	if (pedalHeld) {
		if (state == POLY_Held) {
			return false;
		}
		setState(POLY_Held);
	} else {
		startDecay();
	}
	return true;
}